

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::VarintSizeCases_VarintSize32_Test::
~VarintSizeCases_VarintSize32_Test(VarintSizeCases_VarintSize32_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(VarintSizeCases, VarintSize32) {
  VarintSizeCase kVarintSizeCases_case = GetParam();
  if (kVarintSizeCases_case.value > 0xffffffffu) {
    // Skip 64-bit values.
    return;
  }

  EXPECT_EQ(kVarintSizeCases_case.size,
            CodedOutputStream::VarintSize32(
                static_cast<uint32_t>(kVarintSizeCases_case.value)));
}